

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

FederateState * __thiscall
helics::CommonCore::checkNewInterface
          (CommonCore *this,LocalFederateId federateID,string_view key,InterfaceType type)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  bool bVar1;
  FederateStates FVar2;
  BrokerState BVar3;
  undefined8 uVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  type p_Var6;
  BaseType in_ESI;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_RDI;
  InterfaceType in_R8B;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *info;
  FederateState *fed;
  string_view tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffba8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  anon_class_16_2_20c6df32 *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  undefined8 in_stack_fffffffffffffbe0;
  LocalFederateId federateID_00;
  string_view local_3c0;
  char *local_3b0;
  undefined8 local_3a8;
  undefined1 local_3a0 [32];
  __sv_type local_380;
  undefined1 local_369;
  string_view local_368;
  char *local_358;
  undefined8 local_350;
  undefined1 local_348 [32];
  __sv_type local_328;
  undefined1 local_311;
  char *local_310;
  undefined8 local_308;
  undefined1 local_300 [32];
  __sv_type local_2e0;
  BaseType local_2d0;
  undefined4 local_2cc;
  FederateState *local_2c8;
  undefined1 local_2bd;
  char *local_2b0;
  undefined8 local_2a8;
  undefined1 local_2a0 [32];
  CommonCore *in_stack_fffffffffffffd80;
  string_view local_260;
  InterfaceType local_249;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  LocalFederateId local_22c;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined1 *local_210;
  char *local_208;
  unsigned_long_long in_stack_fffffffffffffe00;
  unsigned_long_long uVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffe08;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar8;
  char *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  size_t sVar9;
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined8 uStack_1b0;
  string_view *local_1a8;
  char *local_1a0;
  undefined8 uStack_198;
  undefined1 *local_190;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined1 *local_170;
  char *local_168;
  undefined8 uStack_160;
  string_view *local_158;
  char *local_150;
  undefined8 uStack_148;
  undefined1 *local_140;
  undefined1 local_138 [48];
  undefined8 local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined8 uStack_f0;
  basic_string_view<char,_std::char_traits<char>_> *local_e8;
  string *local_e0;
  string_view *local_d8;
  char *local_d0;
  undefined8 uStack_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined1 *local_90;
  char *local_88;
  undefined8 uStack_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  string_view *local_70;
  char *local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  federateID_00.fid = (BaseType)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  local_249 = in_R8B;
  local_22c.fid = in_ESI;
  local_260 = interfaceTypeName(in_R8B);
  if (((local_249 == FILTER) || (local_249 == TRANSLATOR)) &&
     (bVar1 = waitCoreRegistration(in_stack_fffffffffffffd80), !bVar1)) {
    BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x467552);
    if (BVar3 < CONNECTED_ERROR) {
      local_2bd = 1;
      pcVar5 = (char *)__cxa_allocate_exception(0x28);
      local_2b0 = "registration timeout exceeded for register {}";
      local_2a8 = 0x2d;
      local_140 = local_2a0;
      local_150 = "registration timeout exceeded for register {}";
      uStack_148 = 0x2d;
      local_158 = &local_260;
      local_168 = "registration timeout exceeded for register {}";
      uStack_160 = 0x2d;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      local_48 = &local_178;
      local_50 = local_188;
      local_178 = 0xd;
      fmt.size_ = in_stack_fffffffffffffe18;
      fmt.data_ = in_stack_fffffffffffffe10;
      args.field_1.values_ = in_stack_fffffffffffffe08.values_;
      args.desc_ = in_stack_fffffffffffffe00;
      local_170 = local_50;
      ::fmt::v11::vformat_abi_cxx11_(fmt,args);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffba0);
      message_00._M_str = pcVar5;
      message_00._M_len = in_stack_fffffffffffffbb8;
      RegistrationFailure::RegistrationFailure
                ((RegistrationFailure *)in_stack_fffffffffffffbb0,message_00);
      local_2bd = 0;
      __cxa_throw(pcVar5,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
    }
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
    message._M_str = in_stack_fffffffffffffbc0;
    message._M_len = in_stack_fffffffffffffbb8;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffffbb0,message);
    __cxa_throw(uVar4,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  local_2c8 = (FederateState *)0x0;
  local_2cc = 0xfffffefd;
  bVar1 = LocalFederateId::operator!=(&local_22c,(LocalFederateId)0xfffffefd);
  if ((bVar1) && (local_249 != FILTER)) {
    local_2d0 = local_22c.fid;
    local_2c8 = getFederateAt((CommonCore *)
                              CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                              federateID_00);
    if (local_2c8 == (FederateState *)0x0) {
      local_311 = 1;
      sVar9 = __cxa_allocate_exception(0x28);
      local_310 = "federateID not valid (register {})";
      local_308 = 0x22;
      local_190 = local_300;
      local_1a0 = "federateID not valid (register {})";
      uStack_198 = 0x22;
      local_1a8 = &local_260;
      local_1b8 = "federateID not valid (register {})";
      uStack_1b0 = 0x22;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      local_38 = &local_1c8;
      local_40 = local_1d8;
      local_1c8 = 0xd;
      fmt_00.size_ = in_stack_fffffffffffffe18;
      fmt_00.data_ = in_stack_fffffffffffffe10;
      args_00.field_1.values_ = in_stack_fffffffffffffe08.values_;
      args_00.desc_ = in_stack_fffffffffffffe00;
      local_1c0 = local_40;
      ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
      local_2e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            (in_stack_fffffffffffffba0);
      message_01._M_str = in_stack_fffffffffffffbc0;
      message_01._M_len = sVar9;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffbb0,message_01);
      local_311 = 0;
      __cxa_throw(sVar9,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
  }
  if ((((uint)(in_RDI->m_obj).inputs._M_h._M_rehash_policy._M_max_load_factor & 1) != 0) &&
     (local_249 != INPUT)) {
    if (local_2c8 == (FederateState *)0x0) {
      BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x467c2e);
      if (0xfffe < BVar3) {
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x28);
        local_3b0 = "Source {} not allowed after entering initializing mode ({})";
        local_3a8 = 0x3b;
        local_3c0 = interfaceTypeName(local_249);
        local_58 = local_3a0;
        local_68 = local_3b0;
        uStack_60 = local_3a8;
        local_70 = &local_3c0;
        local_78 = &local_240;
        local_88 = local_3b0;
        uStack_80 = local_3a8;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        local_18 = &local_98;
        local_20 = local_b8;
        local_98 = 0xdd;
        fmt_02.size_ = in_stack_fffffffffffffe18;
        fmt_02.data_ = in_stack_fffffffffffffe10;
        args_02.field_1.values_ = in_stack_fffffffffffffe08.values_;
        args_02.desc_ = in_stack_fffffffffffffe00;
        local_90 = local_20;
        ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
        local_380 = std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
        message_03._M_str = in_stack_fffffffffffffbc0;
        message_03._M_len = in_stack_fffffffffffffbb8;
        RegistrationFailure::RegistrationFailure
                  ((RegistrationFailure *)in_stack_fffffffffffffbb0,message_03);
        __cxa_throw(this_01,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure
                   );
      }
    }
    else {
      FVar2 = FederateState::getState((FederateState *)0x4679cd);
      if ((FVar2 != CREATED) &&
         (bVar1 = FederateState::getOptionFlag
                            ((FederateState *)
                             CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                             (int)((ulong)in_RDI >> 0x20)), !bVar1)) {
        local_369 = 1;
        x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
        local_358 = "Source {} from {} not allowed after entering initializing mode ({})";
        local_350 = 0x43;
        local_368 = interfaceTypeName(local_249);
        this_00 = FederateState::getIdentifier_abi_cxx11_(local_2c8);
        local_c0 = local_348;
        local_d0 = local_358;
        uStack_c8 = local_350;
        local_d8 = &local_368;
        local_e8 = &local_240;
        local_f8 = local_358;
        uStack_f0 = local_350;
        local_e0 = this_00;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)this_00,
                   (basic_string_view<char,_std::char_traits<char>_> *)x);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)this_00,x);
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)this_00,
                   (basic_string_view<char,_std::char_traits<char>_> *)x);
        local_8 = &local_108;
        local_10 = local_138;
        local_108 = 0xddd;
        fmt_01.size_ = in_stack_fffffffffffffe18;
        fmt_01.data_ = in_stack_fffffffffffffe10;
        args_01.field_1.values_ = in_stack_fffffffffffffe08.values_;
        args_01.desc_ = in_stack_fffffffffffffe00;
        local_100 = local_10;
        ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
        local_328 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffba0);
        message_02._M_str = in_stack_fffffffffffffbc0;
        message_02._M_len = in_stack_fffffffffffffbb8;
        RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_00,message_02);
        local_369 = 0;
        __cxa_throw(x,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
      }
    }
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_240);
  if ((!bVar1) &&
     (p_Var6 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
               read<helics::CommonCore::checkNewInterface(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceType)::__0>
                         (in_RDI,in_stack_fffffffffffffbc8), p_Var6 != (type)0x0)) {
    uVar4 = __cxa_allocate_exception(0x28);
    pcVar5 = "named {} already exists";
    sVar9 = 0x17;
    aVar8.values_ = (value<fmt::v11::context> *)&local_260;
    local_208 = "named {} already exists";
    uVar7 = 0x17;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    local_28 = &local_218;
    local_30 = local_228;
    local_218 = 0xd;
    fmt_03.size_ = sVar9;
    fmt_03.data_ = pcVar5;
    args_03.field_1.values_ = aVar8.values_;
    args_03.desc_ = uVar7;
    local_210 = local_30;
    ::fmt::v11::vformat_abi_cxx11_(fmt_03,args_03);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffba0);
    message_04._M_str = in_stack_fffffffffffffbc0;
    message_04._M_len = in_stack_fffffffffffffbb8;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffffbb0,message_04);
    __cxa_throw(uVar4,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  return local_2c8;
}

Assistant:

FederateState* CommonCore::checkNewInterface(LocalFederateId federateID,
                                             std::string_view key,
                                             InterfaceType type)
{
    std::string_view tname = interfaceTypeName(type);
    if (type == InterfaceType::FILTER || type == InterfaceType::TRANSLATOR) {
        if (!waitCoreRegistration()) {
            if (getBrokerState() >= BrokerState::CONNECTED_ERROR) {
                throw(RegistrationFailure(
                    "core is terminated or in error state no further registration possible"));
            }
            throw(RegistrationFailure(
                fmt::format("registration timeout exceeded for register {}", tname)));
        }
    }

    FederateState* fed{nullptr};
    if (federateID != gLocalCoreId && type != InterfaceType::FILTER) {
        fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier(fmt::format("federateID not valid (register {})", tname)));
        }
    }

    if (disableDynamicSources && type != InterfaceType::INPUT) {
        if (fed != nullptr) {
            if (fed->getState() >= FederateStates::INITIALIZING &&
                !fed->getOptionFlag(HELICS_FLAG_OBSERVER)) {
                throw(RegistrationFailure(fmt::format(
                    "Source {} from {} not allowed after entering initializing mode ({})",
                    interfaceTypeName(type),
                    fed->getIdentifier(),
                    key)));
            }
        } else {
            if (getBrokerState() >= BrokerState::INITIALIZING) {
                throw(RegistrationFailure(
                    fmt::format("Source {} not allowed after entering initializing mode ({})",
                                interfaceTypeName(type),
                                key)));
            }
        }
    }
    if (!key.empty()) {
        const auto* info =
            handles.read([&key, type](auto& hand) { return hand.getInterfaceHandle(key, type); });
        if (info != nullptr) {  // this key is already found
            throw(RegistrationFailure(fmt::format("named {} already exists", tname)));
        }
    }
    return fed;
}